

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int check_assoc_priority(PNode *pn0,PNode *pn1,PNode *pn2)

{
  AssocKind cassoc;
  int iVar1;
  AssocKind cassoc_00;
  int cpri;
  AssocKind passoc;
  int left;
  int in_R9D;
  
  cassoc = pn0->op_assoc;
  passoc = pn1->op_assoc;
  if ((cassoc & 0x18) == ASSOC_NONE) {
    if ((passoc & 0x18) == ASSOC_NONE) {
      return 0;
    }
    cassoc_00 = pn0->assoc;
    if (cassoc_00 == ASSOC_NONE) {
      return 0;
    }
    iVar1 = pn1->op_priority;
    cpri = pn0->priority;
    left = 1;
    goto LAB_00148bff;
  }
  if (passoc == ASSOC_NONE) {
    if ((pn2 != (PNode *)0x0) && (passoc = pn2->op_assoc, passoc != ASSOC_NONE)) {
      iVar1 = pn2->op_priority;
      goto LAB_00148ba7;
    }
  }
  else {
    iVar1 = pn1->op_priority;
LAB_00148ba7:
    iVar1 = check_child(iVar1,passoc,pn0->op_priority,cassoc,1,in_R9D);
    if (iVar1 == 0) {
      return -1;
    }
  }
  cassoc_00 = pn1->assoc;
  if (cassoc_00 == ASSOC_NONE) {
    return 0;
  }
  iVar1 = pn0->op_priority;
  cpri = pn1->priority;
  left = 0;
  passoc = cassoc;
LAB_00148bff:
  iVar1 = check_child(iVar1,passoc,cpri,cassoc_00,left,in_R9D);
  if (iVar1 != 0) {
    return 0;
  }
  return -1;
}

Assistant:

static int check_assoc_priority(PNode *pn0, PNode *pn1, PNode *pn2) {
  if (!IS_UNARY_BINARY_ASSOC(pn0->op_assoc)) {
    if (IS_UNARY_BINARY_ASSOC(pn1->op_assoc)) { /* second token is operator */
      /* check expression pn0 (child of pn1) */
      if (pn0->assoc) {
        if (!check_child(pn1->op_priority, pn1->op_assoc, pn0->priority, pn0->assoc, 0, 1)) return -1;
      }
    }
  } else { /* pn0 is an operator */
    if (pn1->op_assoc) {
      /* check pn0 (child of operator pn1) */
      if (!check_child(pn1->op_priority, pn1->op_assoc, pn0->op_priority, pn0->op_assoc, 0, 1)) return -1;
    } else if (pn2) {
      /* check pn0 (child of operator pn2) */
      if (pn2->op_assoc && !check_child(pn2->op_priority, pn2->op_assoc, pn0->op_priority, pn0->op_assoc, 0, 1))
        return -1;
    }
    /* check expression pn1 (child of pn0)  */
    if (pn1->assoc) {
      if (!check_child(pn0->op_priority, pn0->op_assoc, pn1->priority, pn1->assoc, 1, 0)) return -1;
    }
  }
  return 0;
}